

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::ChompSetInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompSetInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  bool bVar1;
  RuntimeCharSet<char16_t> *matchSet;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  ChompSetInst<(UnifiedRegex::ChompMode)0> *this_local;
  
  Matcher::CompStats(matcher);
  while ((Matcher::CompStats(matcher), *inputOffset < inputLength &&
         (bVar1 = RuntimeCharSet<char16_t>::Get
                            (&(this->super_SetMixin<false>).set,input[*inputOffset]), bVar1))) {
    *inputOffset = *inputOffset + 1;
  }
  *instPointer = *instPointer + 0x29;
  return false;
}

Assistant:

inline bool ChompSetInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if(Mode == ChompMode::Star || (inputOffset < inputLength && matchSet.Get(input[inputOffset])))
        {
            while(true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && matchSet.Get(input[inputOffset]))
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }